

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_sample.cpp
# Opt level: O1

idx_t __thiscall
duckdb::LogicalSample::EstimateCardinality(LogicalSample *this,ClientContext *context)

{
  int iVar1;
  reference this_00;
  pointer pLVar2;
  undefined4 extraout_var;
  pointer pSVar4;
  uint64_t uVar5;
  unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> *this_01;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  ulong uVar3;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::operator[](&(this->super_LogicalOperator).children,0);
  pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(this_00);
  iVar1 = (*pLVar2->_vptr_LogicalOperator[7])(pLVar2,context);
  uVar3 = CONCAT44(extraout_var,iVar1);
  this_01 = &this->sample_options;
  pSVar4 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
           operator->(this_01);
  if (pSVar4->is_percentage == true) {
    auVar7._8_4_ = extraout_var;
    auVar7._0_8_ = uVar3;
    auVar7._12_4_ = 0x45300000;
    dVar8 = (auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0);
    pSVar4 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
             operator->(this_01);
    dVar6 = Value::GetValue<double>(&pSVar4->sample_size);
    dVar6 = (dVar6 / 100.0) * dVar8;
    uVar5 = (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6;
    if (dVar8 < dVar6) {
      uVar5 = uVar3;
    }
  }
  else {
    pSVar4 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
             operator->(this_01);
    uVar5 = Value::GetValue<unsigned_long>(&pSVar4->sample_size);
    if (uVar3 <= uVar5) {
      uVar5 = uVar3;
    }
  }
  return uVar5;
}

Assistant:

idx_t LogicalSample::EstimateCardinality(ClientContext &context) {
	auto child_cardinality = children[0]->EstimateCardinality(context);
	if (sample_options->is_percentage) {
		double sample_cardinality =
		    double(child_cardinality) * (sample_options->sample_size.GetValue<double>() / 100.0);
		if (sample_cardinality > double(child_cardinality)) {
			return child_cardinality;
		}
		return idx_t(sample_cardinality);
	} else {
		auto sample_size = sample_options->sample_size.GetValue<uint64_t>();
		if (sample_size < child_cardinality) {
			return sample_size;
		}
	}
	return child_cardinality;
}